

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void ArrangeScriptProfiles(TArray<ProfileCollector,_ProfileCollector> *profiles)

{
  FBehavior *pFVar1;
  long lVar2;
  int i;
  long lVar3;
  uint mod_num;
  ulong uVar4;
  ProfileCollector prof;
  
  for (uVar4 = 0; uVar4 < FBehavior::StaticModules.Count; uVar4 = uVar4 + 1) {
    pFVar1 = FBehavior::StaticModules.Array[uVar4];
    lVar2 = 0x20;
    prof.Module = pFVar1;
    for (lVar3 = 0; lVar3 < pFVar1->NumScripts; lVar3 = lVar3 + 1) {
      prof.Index = (int)lVar3;
      prof.ProfileData = (ACSProfileInfo *)((long)&pFVar1->Scripts->Number + lVar2);
      TArray<ProfileCollector,_ProfileCollector>::Push(profiles,&prof);
      lVar2 = lVar2 + 0x38;
    }
  }
  return;
}

Assistant:

void ArrangeScriptProfiles(TArray<ProfileCollector> &profiles)
{
	for (unsigned int mod_num = 0; mod_num < FBehavior::StaticModules.Size(); ++mod_num)
	{
		FBehavior *module = FBehavior::StaticModules[mod_num];
		ProfileCollector prof;
		prof.Module = module;
		for (int i = 0; i < module->NumScripts; ++i)
		{
			prof.Index = i;
			prof.ProfileData = &module->Scripts[i].ProfileData;
			profiles.Push(prof);
		}
	}
}